

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_resume_data.cpp
# Opt level: O1

add_torrent_params * __thiscall
libtorrent::read_resume_data
          (add_torrent_params *__return_storage_ptr__,libtorrent *this,span<const_char> buffer,
          error_code *ec)

{
  bdecode_node rd;
  int in_stack_ffffffffffffff80;
  storage_constructor_type local_78;
  bdecode_node local_50;
  
  bdecode(&local_50,this,buffer,(error_code *)0x0,(int *)0x64,2000000,in_stack_ffffffffffffff80);
  if (((error_code *)buffer.m_len)->failed_ == true) {
    local_78.super__Function_base._M_functor._8_8_ = 0;
    local_78.super__Function_base._M_functor._M_unused._M_function_pointer =
         default_storage_constructor;
    local_78._M_invoker =
         std::
         _Function_handler<libtorrent::storage_interface_*(const_libtorrent::storage_params_&,_libtorrent::file_pool_&),_libtorrent::storage_interface_*(*)(const_libtorrent::storage_params_&,_libtorrent::file_pool_&)>
         ::_M_invoke;
    local_78.super__Function_base._M_manager =
         std::
         _Function_handler<libtorrent::storage_interface_*(const_libtorrent::storage_params_&,_libtorrent::file_pool_&),_libtorrent::storage_interface_*(*)(const_libtorrent::storage_params_&,_libtorrent::file_pool_&)>
         ::_M_manager;
    add_torrent_params::add_torrent_params(__return_storage_ptr__,&local_78);
    if (local_78.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_78.super__Function_base._M_manager)
                ((_Any_data *)&local_78,(_Any_data *)&local_78,__destroy_functor);
    }
  }
  else {
    read_resume_data(__return_storage_ptr__,&local_50,(error_code *)buffer.m_len);
  }
  if (local_50.m_tokens.
      super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      .
      super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.m_tokens.
                    super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    .
                    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.m_tokens.
                          super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          .
                          super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.m_tokens.
                          super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          .
                          super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

add_torrent_params read_resume_data(span<char const> buffer, error_code& ec)
	{
		bdecode_node rd = bdecode(buffer, ec);
		if (ec) return add_torrent_params();

		return read_resume_data(rd, ec);
	}